

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

string * PrintHRule_abi_cxx11_(string *__return_storage_ptr__,size_t additionalColumns)

{
  char cVar1;
  long lVar2;
  string column;
  string groupColumn;
  string firstColumn;
  stringstream ss;
  long *local_238;
  ulong local_230;
  long local_228 [2];
  long *local_218;
  ulong local_210;
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  celero::console::SetConsoleColor(Default);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,":","");
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,":","");
  while (local_230 < 0xf) {
    std::__cxx11::string::append((char *)&local_238);
  }
  while (local_210 < GlobalGroupNameColumnWidth) {
    std::__cxx11::string::append((char *)&local_218);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_238,(char *)((long)local_238 + local_230));
  std::__cxx11::string::append((char *)local_1f8);
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,local_218,(long)local_218 + local_210);
  std::__cxx11::string::append((char *)local_1d8);
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"|",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_218,local_210);
  for (lVar2 = additionalColumns + 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_238,local_230);
  }
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintHRule(const size_t additionalColumns = 0)
{
	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

	std::stringstream ss;
	std::string column{":"};
	std::string groupColumn{":"};

	while(column.length() < PrintConstants::ColumnWidth)
	{
		column += "-";
	}

	while(groupColumn.length() < GlobalGroupNameColumnWidth)
	{
		groupColumn += "-";
	}

	std::string firstColumn = column + ":|";
	groupColumn = groupColumn + ":|";

	column += "-:|";

	ss << "|" << groupColumn;

	for(size_t i = 0; i < PrintConstants::NumberOfColumns + additionalColumns - 1; ++i)
	{
		ss << column;
	}

	ss << std::endl;

	return ss.str();
}